

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_api.c
# Opt level: O0

void lua_pushcclosure(lua_State *L,lua_CFunction f,int n)

{
  TValue *pTVar1;
  GCtab *env;
  GCfunc *pGVar2;
  int iVar3;
  GCfunc *fn;
  int n_local;
  lua_CFunction f_local;
  lua_State *L_local;
  
  if (*(ulong *)((L->glref).ptr64 + 0x18) <= *(ulong *)((L->glref).ptr64 + 0x10)) {
    lj_gc_step(L);
  }
  env = getcurrenv(L);
  pGVar2 = lj_func_newC(L,n,env);
  (pGVar2->c).f = f;
  L->top = L->top + -(long)n;
  fn._4_4_ = n;
  while (iVar3 = fn._4_4_ + -1, fn._4_4_ != 0) {
    *(TValue *)((long)pGVar2 + (long)iVar3 * 8 + 0x30) = L->top[iVar3];
    fn._4_4_ = iVar3;
  }
  L->top->u64 = (ulong)pGVar2 | 0xfffb800000000000;
  pTVar1 = L->top;
  L->top = pTVar1 + 1;
  if ((TValue *)(L->maxstack).ptr64 <= pTVar1 + 1) {
    lj_state_growstack1(L);
  }
  return;
}

Assistant:

LUA_API void lua_pushcclosure(lua_State *L, lua_CFunction f, int n)
{
  GCfunc *fn;
  lj_gc_check(L);
  lj_checkapi_slot(n);
  fn = lj_func_newC(L, (MSize)n, getcurrenv(L));
  fn->c.f = f;
  L->top -= n;
  while (n--)
    copyTV(L, &fn->c.upvalue[n], L->top+n);
  setfuncV(L, L->top, fn);
  lj_assertL(iswhite(obj2gco(fn)), "new GC object is not white");
  incr_top(L);
}